

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::WFXMLScanner::scanCharData(WFXMLScanner *this,XMLBuffer *toUse)

{
  XMLCh XVar1;
  XMLReader *pXVar2;
  bool bVar3;
  XMLCh XVar4;
  bool bVar5;
  int iVar6;
  XMLSize_t XVar7;
  XMLSize_t XVar8;
  XMLSize_t count;
  Codes toEmit;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh tmpBuf [9];
  char local_65;
  int local_64;
  XMLCh local_5e;
  bool local_5b;
  XMLCh local_5a;
  XMLBuffer *local_58;
  undefined4 local_4c;
  XMLCh local_48 [12];
  
  toUse->fIndex = 0;
  local_5b = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = true;
  local_5a = L'\0';
  local_65 = '\0';
  bVar3 = false;
  local_4c = (undefined4)CONCAT71((int7)((ulong)&local_65 >> 8),1);
  local_64 = 0;
  local_58 = toUse;
LAB_002c2616:
  do {
    if ((local_64 == 0) && (!bVar3)) {
      pXVar2 = (this->super_XMLScanner).fReaderMgr.fCurReader;
      XVar7 = pXVar2->fCharsAvail - pXVar2->fCharIndex;
      if (XVar7 == 0) {
        count = 0;
      }
      else {
        XVar8 = 0;
        do {
          count = XVar8;
          if ((pXVar2->fgCharCharsTable[(ushort)(pXVar2->fCharBuf + pXVar2->fCharIndex)[XVar8]] & 8)
              == 0) break;
          XVar8 = XVar8 + 1;
          count = XVar7;
        } while (XVar7 != XVar8);
      }
      if (count != 0) {
        XMLBuffer::append(local_58,pXVar2->fCharBuf + pXVar2->fCharIndex,count);
        pXVar2->fCharIndex = pXVar2->fCharIndex + count;
        pXVar2->fCurCol = pXVar2->fCurCol + count;
      }
    }
    pXVar2 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    if ((pXVar2->fCharsAvail <= pXVar2->fCharIndex) &&
       ((pXVar2->fNoMore != false || (bVar5 = XMLReader::refreshCharBuffer(pXVar2), !bVar5)))) {
LAB_002c2902:
      if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                (this,local_58);
      (this->super_XMLScanner).fReaderMgr.fThrowEOE = local_5b;
      return;
    }
    XVar1 = pXVar2->fCharBuf[pXVar2->fCharIndex];
    if (XVar1 == L'<') goto LAB_002c2902;
    pXVar2->fCharIndex = pXVar2->fCharIndex + 1;
    local_5e = XVar1;
    if ((XVar1 & 0xdf50U) == 0) {
      XMLReader::handleEOL(pXVar2,&local_5e,false);
    }
    else {
      pXVar2->fCurCol = pXVar2->fCurCol + 1;
    }
    local_65 = '\0';
    if ((ulong)(ushort)local_5e == 0x26) {
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                (this,local_58);
      bVar5 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
      (this->super_XMLScanner).fReaderMgr.fThrowEOE = false;
      iVar6 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                        (this,0,&local_5e,&local_5a,&local_65);
      (this->super_XMLScanner).fReaderMgr.fThrowEOE = bVar5;
      bVar5 = bVar3;
      if (iVar6 != 1) {
        bVar3 = false;
        goto LAB_002c2616;
      }
    }
    else {
      if ((local_5e & 0xfc00U) == 0xdc00) {
        toEmit = Unexpected2ndSurrogateChar;
        if (!bVar3) {
LAB_002c27be:
          XMLScanner::emitError(&this->super_XMLScanner,toEmit);
        }
      }
      else {
        if ((local_5e & 0xfc00U) == 0xd800) {
          bVar5 = true;
          if (bVar3) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
            bVar5 = bVar3;
          }
          goto LAB_002c280f;
        }
        toEmit = Expected2ndSurrogateChar;
        if (bVar3) goto LAB_002c27be;
        if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)local_5e] &
            0x40) == 0) {
          XMLString::binToText
                    ((uint)(ushort)local_5e,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager)
          ;
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
      }
      bVar5 = false;
    }
LAB_002c280f:
    bVar3 = bVar5;
    iVar6 = 0;
    if (local_65 == '\0') {
      if (local_5e == L'>') {
        iVar6 = 0;
        if (local_64 == 2) {
          local_64 = 2;
          XMLScanner::emitError(&this->super_XMLScanner,BadSequenceInCharData);
        }
      }
      else if (local_5e == L']') {
        if (local_64 == 0) {
          iVar6 = 1;
        }
        else {
          iVar6 = local_64;
          if (local_64 == 1) {
            iVar6 = 2;
          }
        }
      }
    }
    XVar1 = local_5e;
    if (local_58->fIndex == local_58->fCapacity) {
      local_64 = iVar6;
      XMLBuffer::ensureCapacity(local_58,1);
    }
    XVar4 = local_5a;
    XVar8 = local_58->fIndex;
    XVar7 = XVar8 + 1;
    local_58->fIndex = XVar7;
    local_58->fBuffer[XVar8] = XVar1;
    local_64 = iVar6;
    if (local_5a != L'\0') {
      if (XVar7 == local_58->fCapacity) {
        XMLBuffer::ensureCapacity(local_58,1);
      }
      XVar7 = local_58->fIndex;
      local_58->fIndex = XVar7 + 1;
      local_58->fBuffer[XVar7] = XVar4;
      local_5a = L'\0';
      local_64 = iVar6;
    }
  } while( true );
}

Assistant:

void WFXMLScanner::scanCharData(XMLBuffer& toUse)
{
    //  We have to watch for the stupid ]]> sequence, which is illegal in
    //  character data. So this is a little state machine that handles that.
    enum States
    {
        State_Waiting
        , State_GotOne
        , State_GotTwo
    };

    // Reset the buffer before we start
    toUse.reset();

    // Turn on the 'throw at end' flag of the reader manager
    ThrowEOEJanitor jan(&fReaderMgr, true);

    //  In order to be more efficient we have to use kind of a deeply nested
    //  set of blocks here. The outer block puts on a try and catches end of
    //  entity exceptions. The inner loop is the per-character loop. If we
    //  put the try inside the inner loop, it would work but would require
    //  the exception handling code setup/teardown code to be invoked for
    //  each character.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = State_Waiting;
    bool    escaped = false;
    bool    gotLeadingSurrogate = false;
    bool    notDone = true;
    while (notDone)
    {
        try
        {
            while (true)
            {
                //  Eat through as many plain content characters as possible without
                //  needing special handling.  Moving most content characters here,
                //  in this one call, rather than running the overall loop once
                //  per content character, is a speed optimization.
                if (curState == State_Waiting  &&  !gotLeadingSurrogate)
                {
                     fReaderMgr.movePlainContentChars(toUse);
                }

                // Try to get another char from the source
                //   The code from here on down covers all contengencies,
                if (!fReaderMgr.getNextCharIfNot(chOpenAngle, nextCh))
                {
                    // If we were waiting for a trailing surrogate, its an error
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    notDone = false;
                    break;
                }

                //  Watch for a reference. Note that the escapement mechanism
                //  is ignored in this content.
                escaped = false;
                if (nextCh == chAmpersand)
                {
                    sendCharData(toUse);

                    // Turn off the throwing at the end of entity during this
                    ThrowEOEJanitor jan(&fReaderMgr, false);

                    if (scanEntityRef(false, nextCh, secondCh, escaped) != EntityExp_Returned)
                    {
                        gotLeadingSurrogate = false;
                        continue;
                    }
                }
                else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
                {
                    // Deal with surrogate pairs
                    //  Its a leading surrogate. If we already got one, then
                    //  issue an error, else set leading flag to make sure that
                    //  we look for a trailing next time.
                    if (gotLeadingSurrogate)
                    {
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    }
                    else
                        gotLeadingSurrogate = true;
                }
                else
                {
                    //  If its a trailing surrogate, make sure that we are
                    //  prepared for that. Else, its just a regular char so make
                    //  sure that we were not expected a trailing surrogate.
                    if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                    {
                        // Its trailing, so make sure we were expecting it
                        if (!gotLeadingSurrogate)
                            emitError(XMLErrs::Unexpected2ndSurrogateChar);
                    }
                    else
                    {
                        //  Its just a char, so make sure we were not expecting a
                        //  trailing surrogate.
                        if (gotLeadingSurrogate) {
                            emitError(XMLErrs::Expected2ndSurrogateChar);
                        }
                        // Its got to at least be a valid XML character
                        else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                        {
                            XMLCh tmpBuf[9];
                            XMLString::binToText
                            (
                                nextCh
                                , tmpBuf
                                , 8
                                , 16
                                , fMemoryManager
                            );
                            emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        }
                    }
                    gotLeadingSurrogate = false;
                }

                // Keep the state machine up to date
                if (!escaped)
                {
                    if (nextCh == chCloseSquare)
                    {
                        if (curState == State_Waiting)
                            curState = State_GotOne;
                        else if (curState == State_GotOne)
                            curState = State_GotTwo;
                    }
                    else if (nextCh == chCloseAngle)
                    {
                        if (curState == State_GotTwo)
                            emitError(XMLErrs::BadSequenceInCharData);
                        curState = State_Waiting;
                    }
                    else
                    {
                        curState = State_Waiting;
                    }
                }
                else
                {
                    curState = State_Waiting;
                }

                // Add this char to the buffer
                toUse.append(nextCh);

                if (secondCh)
                {
                    toUse.append(secondCh);
                    secondCh=0;
                }
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  Some entity ended, so we have to send any accumulated
            //  chars and send an end of entity event.
            sendCharData(toUse);
            gotLeadingSurrogate = false;

            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());
        }
    }

    // Send any char data that we accumulated into the buffer
    sendCharData(toUse);
}